

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9ExprMakeTree(jx9_gen_state *pGen,SySet *pExprNode,jx9_expr_node **ppRoot)

{
  sxi32 sVar1;
  jx9_expr_node *pjStack_38;
  sxi32 rc;
  jx9_expr_node *pNode;
  jx9_expr_node **apNode;
  jx9_expr_node **ppRoot_local;
  SySet *pExprNode_local;
  jx9_gen_state *pGen_local;
  
  apNode = ppRoot;
  ppRoot_local = (jx9_expr_node **)pExprNode;
  pExprNode_local = (SySet *)pGen;
  SySetReset(pExprNode);
  pjStack_38 = (jx9_expr_node *)0x0;
  while( true ) {
    if (pExprNode_local[8].pUserData <= *(void **)&pExprNode_local[8].eSize) {
      if (*(int *)(ppRoot_local + 2) == 0) {
        *apNode = (jx9_expr_node *)0x0;
        pGen_local._4_4_ = 0;
      }
      else {
        pNode = ppRoot_local[1];
        pGen_local._4_4_ =
             ExprVerifyNodes((jx9_gen_state *)pExprNode_local,(jx9_expr_node **)pNode,
                             *(sxi32 *)(ppRoot_local + 2));
        if (pGen_local._4_4_ == 0) {
          pGen_local._4_4_ =
               ExprMakeTree((jx9_gen_state *)pExprNode_local,(jx9_expr_node **)pNode,
                            *(sxi32 *)(ppRoot_local + 2));
          if (pGen_local._4_4_ == 0) {
            *apNode = (jx9_expr_node *)pNode->pOp;
            pGen_local._4_4_ = 0;
          }
          else {
            *apNode = (jx9_expr_node *)0x0;
          }
        }
        else {
          *apNode = (jx9_expr_node *)0x0;
        }
      }
      return pGen_local._4_4_;
    }
    sVar1 = ExprExtractNode((jx9_gen_state *)pExprNode_local,&stack0xffffffffffffffc8);
    if (sVar1 != 0) break;
    SySetPut((SySet *)ppRoot_local,&stack0xffffffffffffffc8);
  }
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9ExprMakeTree(jx9_gen_state *pGen, SySet *pExprNode, jx9_expr_node **ppRoot)
{
	jx9_expr_node **apNode;
	jx9_expr_node *pNode;
	sxi32 rc;
	/* Reset node container */
	SySetReset(pExprNode);
	pNode = 0; /* Prevent compiler warning */
	/* Extract nodes one after one until we hit the end of the input */
	while( pGen->pIn < pGen->pEnd ){
		rc = ExprExtractNode(&(*pGen), &pNode);
		if( rc != SXRET_OK ){
			return rc;
		}
		/* Save the extracted node */
		SySetPut(pExprNode, (const void *)&pNode);
	}
	if( SySetUsed(pExprNode) < 1 ){
		/* Empty expression [i.e: A semi-colon;] */
		*ppRoot = 0;
		return SXRET_OK;
	}
	apNode = (jx9_expr_node **)SySetBasePtr(pExprNode);
	/* Make sure we are dealing with valid nodes */
	rc = ExprVerifyNodes(&(*pGen), apNode, (sxi32)SySetUsed(pExprNode));
	if( rc != SXRET_OK ){
		/* Don't worry about freeing memory, upper layer will
		 * cleanup the mess left behind.
		 */
		*ppRoot = 0;
		return rc;
	}
	/* Build the tree */
	rc = ExprMakeTree(&(*pGen), apNode, (sxi32)SySetUsed(pExprNode));
	if( rc != SXRET_OK ){
		/* Something goes wrong [i.e: Syntax error] */
		*ppRoot = 0;
		return rc;
	}
	/* Point to the root of the tree */
	*ppRoot = apNode[0];
	return SXRET_OK;
}